

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblackoilanalysis.cpp
# Opt level: O2

void __thiscall
TPZBlackOilAnalysis::PostProcess(TPZBlackOilAnalysis *this,TPZVec<double> *loc,ostream *out)

{
  double dVar1;
  ostream *poVar2;
  
  dVar1 = this->fSimulationTime;
  poVar2 = std::operator<<(out,"\nSOLUTION #");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->fCurrentStep);
  std::operator<<(poVar2," AT TIME = ");
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  TPZAnalysis::PostProcess((TPZAnalysis *)this,loc,out);
  poVar2 = std::operator<<(out,"\n***************************************\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void TPZBlackOilAnalysis::PostProcess(TPZVec<REAL> &loc, std::ostream &out){
    REAL T = this->fSimulationTime;
    out << "\nSOLUTION #" << this->fCurrentStep << " AT TIME = " << T << std::endl;
    TPZLinearAnalysis::PostProcess(loc, out);
    out << "\n***************************************\n" << std::endl;
}